

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

int ON_SN_BLOCK::CompareMaxSN(void *a,void *b)

{
  ulong uVar1;
  ulong uVar2;
  ON__UINT64 snb;
  ON__UINT64 sna;
  void *b_local;
  void *a_local;
  
  uVar1 = *(ulong *)(*a + 0x18);
  uVar2 = *(ulong *)(*b + 0x18);
  if (uVar1 < uVar2) {
    a_local._4_4_ = -1;
    if (uVar1 == 0) {
      a_local._4_4_ = 1;
    }
  }
  else if (uVar2 < uVar1) {
    a_local._4_4_ = 1;
    if (uVar2 == 0) {
      a_local._4_4_ = -1;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int ON_SN_BLOCK::CompareMaxSN(const void* a, const void* b)
{
  const ON__UINT64 sna = (*((const ON_SN_BLOCK*const*)a))->m_sn1;
  const ON__UINT64 snb = (*((const ON_SN_BLOCK*const*)b))->m_sn1;
  if ( sna < snb )
  {
    return (0 == sna) ? 1 : -1;
  }
  if ( snb < sna )
  {
    return (0 == snb) ? -1 : 1;
  }
  return 0;
}